

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Menu.cpp
# Opt level: O0

void __thiscall Menu::Menu(Menu *this,string *fileName)

{
  bool bVar1;
  istream *piVar2;
  allocator local_251;
  string local_250 [8];
  string input;
  long local_220;
  ifstream inputFile;
  string *fileName_local;
  Menu *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::ifstream::ifstream(&local_220);
  std::ifstream::open((string *)&local_220,(_Ios_Openmode)fileName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"",&local_251);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if (bVar1) {
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_220,local_250,'\n');
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
      if (!bVar1) break;
      std::__cxx11::string::append((string *)this);
      std::__cxx11::string::append((char *)this);
    }
    std::ifstream::close();
  }
  else {
    std::__cxx11::string::operator=((string *)this,"Nothing was loaded.");
  }
  std::__cxx11::string::~string(local_250);
  std::ifstream::~ifstream(&local_220);
  return;
}

Assistant:

Menu::Menu(std::string fileName) {
    // Open the file for reading
    std::ifstream inputFile;

    inputFile.open(fileName);

    std::string input = "";

    // Read each line of the file into the menu option string

    if(inputFile){
        while( std::getline(inputFile, input, '\n') ){
            options.append(input);
            options.append("\n");
        }
        inputFile.close();
    }
    else {
        options = "Nothing was loaded.";
    }
}